

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O2

void __thiscall
spoa::SisdAlignmentEngine::Initialize
          (SisdAlignmentEngine *this,char *sequence,uint32_t sequence_len,Graph *graph)

{
  char cVar1;
  AlignmentSubtype AVar2;
  AlignmentType AVar3;
  pointer puVar4;
  pointer piVar5;
  Implementation *pIVar6;
  pointer puVar7;
  long lVar8;
  pointer ppNVar9;
  pointer ppNVar10;
  int32_t *piVar11;
  int32_t *piVar12;
  pointer ppEVar13;
  Implementation *pIVar14;
  uint uVar15;
  uint32_t i;
  ulong uVar16;
  ulong uVar17;
  pointer ppEVar18;
  int iVar19;
  uint32_t i_1;
  uint uVar20;
  uint32_t i_6;
  uint32_t j_4;
  int iVar21;
  int iVar22;
  const_iterator __end3;
  uint32_t j_2;
  uint32_t j;
  ulong uVar23;
  
  puVar4 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  piVar5 = (graph->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar6 = (this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
           .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl;
  uVar15 = sequence_len + 1;
  iVar19 = 0;
  puVar7 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar16 = 0; uVar16 < graph->num_codes_; uVar16 = uVar16 + 1) {
    iVar21 = 0;
    iVar22 = piVar5[uVar16 & 0xff];
    lVar8 = *(long *)&(pIVar6->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl;
    for (uVar23 = 0; *(int *)(lVar8 + (ulong)(uint)(iVar19 + (int)uVar23) * 4) = iVar21,
        sequence_len != uVar23; uVar23 = uVar23 + 1) {
      iVar21 = (int)*(char *)((long)&(this->super_AlignmentEngine)._vptr_AlignmentEngine +
                             ((ulong)(sequence[uVar23] == (char)iVar22) ^ 0x11));
    }
    iVar19 = iVar19 + uVar15;
  }
  ppNVar9 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar10 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pIVar6 = (this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
           .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl;
  for (uVar20 = 0; (ulong)uVar20 < (ulong)((long)ppNVar10 - (long)ppNVar9 >> 3); uVar20 = uVar20 + 1
      ) {
    *(uint *)(*(long *)&(pIVar6->node_id_to_rank).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> +
             (ulong)ppNVar9[uVar20]->id * 4) = uVar20;
  }
  AVar2 = (this->super_AlignmentEngine).subtype_;
  uVar23 = (ulong)uVar15;
  uVar16 = (ulong)((int)((ulong)((long)puVar4 - (long)puVar7) >> 3) + 1);
  if (AVar2 != kLinear) {
    if (AVar2 == kConvex) {
      piVar11 = pIVar6->O;
      *piVar11 = 0;
      piVar12 = pIVar6->Q;
      *piVar12 = 0;
      iVar19 = (int)(this->super_AlignmentEngine).q_;
      cVar1 = (this->super_AlignmentEngine).c_;
      for (uVar17 = 1; uVar17 < uVar23; uVar17 = uVar17 + 1) {
        piVar11[uVar17] = -0x7ffffc00;
        piVar12[uVar17] = iVar19;
        iVar19 = iVar19 + cVar1;
      }
      for (uVar17 = 1; uVar17 < uVar16; uVar17 = uVar17 + 1) {
        iVar22 = (int)(this->super_AlignmentEngine).c_;
        ppEVar18 = (ppNVar9[uVar17 - 1]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar13 = *(pointer *)
                    ((long)&(ppNVar9[uVar17 - 1]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        iVar19 = (this->super_AlignmentEngine).q_ - iVar22;
        if (ppEVar18 != ppEVar13) {
          iVar19 = -0x7ffffc00;
        }
        for (; ppEVar18 != ppEVar13; ppEVar18 = ppEVar18 + 1) {
          if (iVar19 <= piVar11[(*(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         + (ulong)(*ppEVar18)->tail->id * 4) + 1) * uVar15]) {
            iVar19 = piVar11[(*(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      + (ulong)(*ppEVar18)->tail->id * 4) + 1) * uVar15];
          }
        }
        uVar20 = uVar15 * (int)uVar17;
        piVar11[uVar20] = iVar19 + iVar22;
        piVar12[uVar20] = -0x7ffffc00;
      }
    }
    else if (AVar2 != kAffine) goto LAB_0011df2e;
    piVar11 = pIVar6->F;
    *piVar11 = 0;
    piVar12 = pIVar6->E;
    *piVar12 = 0;
    iVar19 = (int)(this->super_AlignmentEngine).g_;
    cVar1 = (this->super_AlignmentEngine).e_;
    for (uVar17 = 1; uVar17 < uVar23; uVar17 = uVar17 + 1) {
      piVar11[uVar17] = -0x7ffffc00;
      piVar12[uVar17] = iVar19;
      iVar19 = iVar19 + cVar1;
    }
    for (uVar17 = 1; uVar17 < uVar16; uVar17 = uVar17 + 1) {
      iVar22 = (int)(this->super_AlignmentEngine).e_;
      ppEVar18 = (ppNVar9[uVar17 - 1]->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar13 = *(pointer *)
                  ((long)&(ppNVar9[uVar17 - 1]->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      iVar19 = (this->super_AlignmentEngine).g_ - iVar22;
      if (ppEVar18 != ppEVar13) {
        iVar19 = -0x7ffffc00;
      }
      for (; ppEVar18 != ppEVar13; ppEVar18 = ppEVar18 + 1) {
        if (iVar19 <= piVar11[(*(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       + (ulong)(*ppEVar18)->tail->id * 4) + 1) * uVar15]) {
          iVar19 = piVar11[(*(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                    + (ulong)(*ppEVar18)->tail->id * 4) + 1) * uVar15];
        }
      }
      uVar20 = uVar15 * (int)uVar17;
      piVar11[uVar20] = iVar19 + iVar22;
      piVar12[uVar20] = -0x7ffffc00;
    }
  }
  *pIVar6->H = 0;
LAB_0011df2e:
  AVar3 = (this->super_AlignmentEngine).type_;
  if (AVar3 == kOV) {
    if (AVar2 == kConvex) {
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      for (uVar17 = 1; uVar17 < uVar23; uVar17 = uVar17 + 1) {
        iVar19 = pIVar6->E[uVar17];
        if (pIVar6->E[uVar17] < pIVar6->Q[uVar17]) {
          iVar19 = pIVar6->Q[uVar17];
        }
        pIVar6->H[uVar17] = iVar19;
      }
    }
    else if (AVar2 == kAffine) {
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      for (uVar17 = 1; uVar17 < uVar23; uVar17 = uVar17 + 1) {
        pIVar6->H[uVar17] = pIVar6->E[uVar17];
      }
    }
    else if (AVar2 == kLinear) {
      iVar22 = (int)(this->super_AlignmentEngine).g_;
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      iVar19 = iVar22;
      for (uVar17 = 1; uVar17 < uVar23; uVar17 = uVar17 + 1) {
        pIVar6->H[uVar17] = iVar19;
        iVar19 = iVar19 + iVar22;
      }
    }
    pIVar6 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    uVar20 = uVar15;
    for (uVar23 = 1; uVar17 = (ulong)uVar20, uVar23 < uVar16; uVar23 = uVar23 + 1) {
      uVar20 = uVar20 + uVar15;
      pIVar6->H[uVar17] = 0;
    }
  }
  else if (AVar3 == kNW) {
    if (AVar2 == kConvex) {
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      for (uVar17 = 1; uVar17 < uVar23; uVar17 = uVar17 + 1) {
        iVar19 = pIVar6->E[uVar17];
        if (pIVar6->E[uVar17] < pIVar6->Q[uVar17]) {
          iVar19 = pIVar6->Q[uVar17];
        }
        pIVar6->H[uVar17] = iVar19;
      }
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      uVar20 = uVar15;
      for (uVar23 = 1; uVar23 < uVar16; uVar23 = uVar23 + 1) {
        iVar19 = pIVar6->F[uVar20];
        if (pIVar6->F[uVar20] < pIVar6->O[uVar20]) {
          iVar19 = pIVar6->O[uVar20];
        }
        pIVar6->H[uVar20] = iVar19;
        uVar20 = uVar20 + uVar15;
      }
    }
    else if (AVar2 == kAffine) {
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      for (uVar17 = 1; uVar17 < uVar23; uVar17 = uVar17 + 1) {
        pIVar6->H[uVar17] = pIVar6->E[uVar17];
      }
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      uVar20 = uVar15;
      for (uVar23 = 1; uVar23 < uVar16; uVar23 = uVar23 + 1) {
        pIVar6->H[uVar20] = pIVar6->F[uVar20];
        uVar20 = uVar20 + uVar15;
      }
    }
    else if (AVar2 == kLinear) {
      iVar22 = (int)(this->super_AlignmentEngine).g_;
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      iVar19 = iVar22;
      for (uVar17 = 1; uVar17 < uVar23; uVar17 = uVar17 + 1) {
        pIVar6->H[uVar17] = iVar19;
        iVar19 = iVar19 + iVar22;
      }
      cVar1 = (this->super_AlignmentEngine).g_;
      pIVar6 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
               .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl;
      for (uVar23 = 1; uVar23 < uVar16; uVar23 = uVar23 + 1) {
        pIVar14 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        ppEVar18 = (ppNVar9[uVar23 - 1]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar13 = *(pointer *)
                    ((long)&(ppNVar9[uVar23 - 1]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        iVar19 = -0x7ffffc00;
        if (ppEVar18 == ppEVar13) {
          iVar19 = 0;
        }
        for (; ppEVar18 != ppEVar13; ppEVar18 = ppEVar18 + 1) {
          iVar22 = pIVar14->H
                   [(*(int *)(*(long *)&(pIVar14->node_id_to_rank).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             + (ulong)(*ppEVar18)->tail->id * 4) + 1) * uVar15];
          if (iVar19 <= iVar22) {
            iVar19 = iVar22;
          }
        }
        pIVar6->H[uVar15 * (int)uVar23] = iVar19 + cVar1;
      }
    }
  }
  else if (AVar3 == kSW) {
    pIVar6 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    for (uVar17 = 1; uVar17 < uVar23; uVar17 = uVar17 + 1) {
      pIVar6->H[uVar17] = 0;
    }
    pIVar6 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    uVar20 = uVar15;
    for (uVar23 = 1; uVar17 = (ulong)uVar20, uVar23 < uVar16; uVar23 = uVar23 + 1) {
      uVar20 = uVar20 + uVar15;
      pIVar6->H[uVar17] = 0;
    }
  }
  return;
}

Assistant:

void SisdAlignmentEngine::Initialize(
    const char* sequence, std::uint32_t sequence_len,
    const Graph& graph) noexcept {
  std::uint32_t matrix_width = sequence_len + 1;
  std::uint32_t matrix_height = graph.nodes().size() + 1;

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    pimpl_->sequence_profile[i * matrix_width] = 0;
    for (std::uint32_t j = 0; j < sequence_len; ++j) {
      pimpl_->sequence_profile[i * matrix_width + (j + 1)] =
          (c == sequence[j] ? m_ : n_);
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      pimpl_->O[0] = 0;
      pimpl_->Q[0] = 0;
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->O[j] = kNegativeInfinity;
        pimpl_->Q[j] = q_ + (j - 1) * c_;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->O[pred_i * matrix_width]);
        }
        pimpl_->O[i * matrix_width] = penalty + c_;
        pimpl_->Q[i * matrix_width] = kNegativeInfinity;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      pimpl_->F[0] = 0;
      pimpl_->E[0] = 0;
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->F[j] = kNegativeInfinity;
        pimpl_->E[j] = g_ + (j - 1) * e_;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->F[pred_i * matrix_width]);
        }
        pimpl_->F[i * matrix_width] = penalty + e_;
        pimpl_->E[i * matrix_width] = kNegativeInfinity;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      pimpl_->H[0] = 0;
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->H[j] = 0;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        pimpl_->H[i * matrix_width] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = std::max(pimpl_->Q[j], pimpl_->E[j]);
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            pimpl_->H[i * matrix_width] = std::max(
                pimpl_->O[i * matrix_width],
                pimpl_->F[i * matrix_width]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            pimpl_->H[i * matrix_width] = pimpl_->F[i * matrix_width];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = j * g_;
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->H[pred_i * matrix_width]);
            }
            pimpl_->H[i * matrix_width] = penalty + g_;
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = std::max(pimpl_->Q[j], pimpl_->E[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = j * g_;
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        pimpl_->H[i * matrix_width] = 0;
      }
      break;
    default:
      break;
  }
}